

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar1 = (pIVar2->DC).CursorPos.y;
    iVar4 = (int)(((pIVar2->ClipRect).Min.y - fVar1) / items_height);
    if (GImGui->NavMoveRequest == true) {
      iVar4 = iVar4 - (uint)(GImGui->NavMoveDir == 2);
    }
    iVar5 = (int)(((pIVar2->ClipRect).Max.y - fVar1) / items_height);
    if (GImGui->NavMoveRequest != false) {
      iVar5 = iVar5 + (uint)(GImGui->NavMoveDir == 3);
    }
    iVar3 = items_count;
    if (iVar4 < items_count) {
      iVar3 = iVar4;
    }
    iVar6 = 0;
    if (-1 < iVar4) {
      iVar6 = iVar3;
    }
    iVar5 = iVar5 + 1;
    if (iVar5 < items_count) {
      items_count = iVar5;
    }
    if (iVar5 < iVar6) {
      items_count = iVar6;
    }
    *out_items_display_start = iVar6;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((window->ClipRect.Min.y - pos.y) / items_height);
    int end = (int)((window->ClipRect.Max.y - pos.y) / items_height);
    if (g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Up) // When performing a navigation request, ensure we have one item extra in the direction we are moving to
        start--;
    if (g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}